

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.pb.cc
# Opt level: O0

size_t __thiscall Messages::AddressBook::ByteSizeLong(AddressBook *this)

{
  bool bVar1;
  int iVar2;
  reference value;
  size_t sVar3;
  int cached_size;
  Person *msg;
  const_iterator __end1;
  const_iterator __begin1;
  RepeatedPtrField<Messages::Person> *__range1;
  AddressBook *pAStack_30;
  uint32 cached_has_bits;
  size_t total_size;
  AddressBook *this_local;
  
  iVar2 = _internal_people_size(this);
  pAStack_30 = (AddressBook *)(long)iVar2;
  __end1 = google::protobuf::RepeatedPtrField<Messages::Person>::begin(&this->people_);
  msg = (Person *)google::protobuf::RepeatedPtrField<Messages::Person>::end(&this->people_);
  while( true ) {
    bVar1 = google::protobuf::internal::RepeatedPtrIterator<const_Messages::Person>::operator!=
                      (&__end1,(iterator *)&msg);
    if (!bVar1) break;
    value = google::protobuf::internal::RepeatedPtrIterator<const_Messages::Person>::operator*
                      (&__end1);
    sVar3 = google::protobuf::internal::WireFormatLite::MessageSize<Messages::Person>(value);
    pAStack_30 = (AddressBook *)(&pAStack_30->super_Message + sVar3);
    google::protobuf::internal::RepeatedPtrIterator<const_Messages::Person>::operator++(&__end1);
  }
  if (((uint)*(undefined8 *)&this->field_0x8 & 1) == 1) {
    this_local = (AddressBook *)
                 google::protobuf::internal::ComputeUnknownFieldsSize
                           ((InternalMetadata *)&this->field_0x8,(ulong)pAStack_30,
                            &this->_cached_size_);
  }
  else {
    iVar2 = google::protobuf::internal::ToCachedSize((size_t)pAStack_30);
    SetCachedSize(this,iVar2);
    this_local = pAStack_30;
  }
  return (size_t)this_local;
}

Assistant:

size_t AddressBook::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:Messages.AddressBook)
  size_t total_size = 0;

  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .Messages.Person people = 1;
  total_size += 1UL * this->_internal_people_size();
  for (const auto& msg : this->people_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    return ::PROTOBUF_NAMESPACE_ID::internal::ComputeUnknownFieldsSize(
        _internal_metadata_, total_size, &_cached_size_);
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}